

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O3

size_t bufferToRle(uint8_t *buffer,int size,int offsetX,int y,Span *out)

{
  uint8_t uVar1;
  uint8_t uVar2;
  undefined4 uVar3;
  size_t sVar4;
  short sVar5;
  undefined4 uVar6;
  uint8_t uVar7;
  long lVar8;
  
  uVar7 = *buffer;
  if (size < 1) {
    sVar4 = 0;
    sVar5 = 0;
  }
  else {
    lVar8 = 0;
    uVar6 = 0;
    sVar4 = 0;
    do {
      uVar1 = buffer[lVar8];
      uVar2 = uVar7;
      uVar3 = uVar6;
      if ((uVar7 != uVar1) && (uVar2 = uVar1, uVar3 = (int)lVar8, uVar7 != '\0')) {
        out->y = (short)y;
        out->x = (short)uVar6 + (short)offsetX;
        out->len = (short)lVar8 - (short)uVar6;
        out->coverage = uVar7;
        out = out + 1;
        sVar4 = sVar4 + 1;
      }
      uVar6 = uVar3;
      uVar7 = uVar2;
      sVar5 = (short)uVar6;
      lVar8 = lVar8 + 1;
    } while (size != (int)lVar8);
  }
  if (uVar7 != '\0') {
    out->y = (short)y;
    out->x = (short)offsetX + sVar5;
    out->len = (short)size - sVar5;
    out->coverage = uVar7;
    sVar4 = sVar4 + 1;
  }
  return sVar4;
}

Assistant:

size_t bufferToRle(uint8_t *buffer, int size, int offsetX, int y,
                   VRle::Span *out)
{
    size_t count = 0;
    uint8_t value = buffer[0];
    int    curIndex = 0;

    // size = offsetX < 0 ? size + offsetX : size;
    for (int i = 0; i < size; i++) {
        uint8_t curValue = buffer[0];
        if (value != curValue) {
            if (value) {
                out->y = y;
                out->x = offsetX + curIndex;
                out->len = i - curIndex;
                out->coverage = value;
                out++;
                count++;
            }
            curIndex = i;
            value = curValue;
        }
        buffer++;
    }
    if (value) {
        out->y = y;
        out->x = offsetX + curIndex;
        out->len = size - curIndex;
        out->coverage = value;
        count++;
    }
    return count;
}